

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngdec.c
# Opt level: O1

int ExtractMetadataFromPNG
              (png_structp png,png_infop head_info,png_infop end_info,Metadata *metadata)

{
  char *__s1;
  int *piVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  anon_struct_24_3_f6017608 *paVar6;
  int iVar7;
  png_textp text;
  png_uint_32 len;
  png_bytep profile;
  int comp_type;
  png_charp name;
  int *local_90;
  uint local_84;
  MetadataPayload *local_80;
  png_structp local_78;
  png_infop local_70;
  png_infop local_68;
  ulong local_60;
  png_infop local_58;
  Metadata *local_50;
  char *local_48;
  undefined1 local_3c [4];
  undefined1 local_38 [8];
  
  local_80 = &metadata->iccp;
  local_60 = 0;
  local_78 = png;
  local_70 = head_info;
  local_68 = end_info;
  local_50 = metadata;
  do {
    local_58 = local_68;
    if ((int)local_60 == 0) {
      local_58 = local_70;
    }
    local_90 = (int *)0x0;
    iVar3 = png_get_text(png,local_58,&local_90);
    if (iVar3 != 0) {
      iVar7 = 0;
      do {
        piVar1 = local_90;
        __s1 = *(char **)(local_90 + 2);
        iVar4 = strcmp(__s1,"Raw profile type exif");
        paVar6 = kPNGMetadataMap;
        if (iVar4 != 0) {
          lVar2 = 0;
          do {
            lVar5 = lVar2;
            if (lVar5 + 0x18 == 0x60) goto LAB_0010921f;
            iVar4 = strcmp(__s1,*(char **)((long)&kPNGMetadataMap[1].name + lVar5));
            lVar2 = lVar5 + 0x18;
          } while (iVar4 != 0);
          paVar6 = (anon_struct_24_3_f6017608 *)(lVar5 + 0x169c38);
        }
        if (*(long *)((long)&(local_50->exif).bytes + paVar6->storage_offset) == 0) {
          iVar4 = (*paVar6->process)(*(char **)(piVar1 + 4),
                                     *(size_t *)(piVar1 + (ulong)(*piVar1 - 1U < 2) * 2 + 6),
                                     (MetadataPayload *)
                                     ((long)&(local_50->exif).bytes + paVar6->storage_offset));
          if (iVar4 == 0) {
            ExtractMetadataFromPNG_cold_1();
            return 0;
          }
        }
        else {
          fprintf(_stderr,"Ignoring additional \'%s\'\n",__s1);
        }
LAB_0010921f:
        iVar7 = iVar7 + 1;
        local_90 = local_90 + 0xe;
      } while (iVar7 != iVar3);
    }
    png = local_78;
    iVar3 = png_get_iCCP(local_78,local_58,local_38,local_3c,&local_48,&local_84);
    if ((iVar3 == 0x1000) && (iVar3 = MetadataCopy(local_48,(ulong)local_84,local_80), iVar3 == 0))
    {
      return 0;
    }
    iVar3 = (int)local_60;
    local_60 = (ulong)(iVar3 + 1);
    if (iVar3 != 0) {
      return 1;
    }
  } while( true );
}

Assistant:

static int ExtractMetadataFromPNG(png_structp png,
                                  png_infop const head_info,
                                  png_infop const end_info,
                                  Metadata* const metadata) {
  int p;

  for (p = 0; p < 2; ++p)  {
    png_infop const info = (p == 0) ? head_info : end_info;
    png_textp text = NULL;
    const png_uint_32 num = png_get_text(png, info, &text, NULL);
    png_uint_32 i;
    // Look for EXIF / XMP metadata.
    for (i = 0; i < num; ++i, ++text) {
      int j;
      for (j = 0; kPNGMetadataMap[j].name != NULL; ++j) {
        if (!strcmp(text->key, kPNGMetadataMap[j].name)) {
          MetadataPayload* const payload =
              (MetadataPayload*)((uint8_t*)metadata +
                                 kPNGMetadataMap[j].storage_offset);
          png_size_t text_length;
          switch (text->compression) {
#ifdef PNG_iTXt_SUPPORTED
            case PNG_ITXT_COMPRESSION_NONE:
            case PNG_ITXT_COMPRESSION_zTXt:
              text_length = text->itxt_length;
              break;
#endif
            case PNG_TEXT_COMPRESSION_NONE:
            case PNG_TEXT_COMPRESSION_zTXt:
            default:
              text_length = text->text_length;
              break;
          }
          if (payload->bytes != NULL) {
            fprintf(stderr, "Ignoring additional '%s'\n", text->key);
          } else if (!kPNGMetadataMap[j].process(text->text, text_length,
                                                 payload)) {
            fprintf(stderr, "Failed to process: '%s'\n", text->key);
            return 0;
          }
          break;
        }
      }
    }
    // Look for an ICC profile.
    {
      png_charp name;
      int comp_type;
#if LOCAL_PNG_PREREQ(1,5)
      png_bytep profile;
#else
      png_charp profile;
#endif
      png_uint_32 len;

      if (png_get_iCCP(png, info,
                       &name, &comp_type, &profile, &len) == PNG_INFO_iCCP) {
        if (!MetadataCopy((const char*)profile, len, &metadata->iccp)) return 0;
      }
    }
  }
  return 1;
}